

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_peek.c
# Opt level: O0

ssize_t mpt_queue_peek(mpt_decode_queue *qu,size_t max,void *dst)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int local_70;
  mpt_decode_queue *pmStack_68;
  int ret;
  size_t len;
  size_t off;
  iovec src;
  mpt_message msg;
  void *dst_local;
  size_t max_local;
  mpt_decode_queue *qu_local;
  
  uVar1 = (qu->data).len;
  if (uVar1 == 0) {
    qu_local = (mpt_decode_queue *)0xfffffffffffffff0;
  }
  else {
    sVar4 = (qu->data).off;
    sVar3 = (long)(qu->data).base + sVar4;
    src.iov_len = uVar1;
    if ((qu->data).max - sVar4 < uVar1) {
      src.iov_len = (qu->data).max - sVar4;
      off = (size_t)(qu->data).base;
      src.iov_base = (void *)(uVar1 - src.iov_len);
    }
    len = (qu->_state).data.pos;
    if (qu->_dec == (mpt_data_decoder_t)0x0) {
      iVar2 = (int)(qu->_state).data.msg;
      if (-1 < iVar2) {
        len = (long)iVar2 + len;
      }
      if (dst == (void *)0x0) {
        local_70 = (int)uVar1 - (int)len;
        if (local_70 < 0) {
          local_70 = -0x10;
        }
        qu_local = (mpt_decode_queue *)(long)local_70;
      }
      else if ((len == 0) ||
              (sVar4 = mpt_message_read((mpt_message *)&src.iov_len,len,(void *)0x0), len <= sVar4))
      {
        qu_local = (mpt_decode_queue *)mpt_message_read((mpt_message *)&src.iov_len,max,dst);
      }
      else {
        qu_local = (mpt_decode_queue *)0xfffffffffffffff0;
      }
    }
    else {
      uVar1 = (qu->_state).curr;
      if (uVar1 < len) {
        len = uVar1;
      }
      if ((len == 0) ||
         (sVar4 = mpt_message_read((mpt_message *)&src.iov_len,len,(void *)0x0), len <= sVar4)) {
        src.iov_base = (void *)src.iov_len;
        (qu->_state).data.pos = (qu->_state).data.pos - len;
        (qu->_state).curr = (qu->_state).curr - len;
        off = sVar3;
        iVar2 = (*qu->_dec)(&qu->_state,(iovec *)&off,0);
        sVar4 = (qu->_state).data.pos;
        (qu->_state).data.pos = sVar4 + len;
        (qu->_state).curr = len + (qu->_state).curr;
        pmStack_68 = (mpt_decode_queue *)(qu->_state).data.len;
        qu_local = pmStack_68;
        if ((-1 < iVar2) && (dst != (void *)0x0)) {
          if (max < pmStack_68) {
            pmStack_68 = (mpt_decode_queue *)max;
          }
          memcpy(dst,(void *)(sVar3 + sVar4),(size_t)pmStack_68);
          qu_local = pmStack_68;
        }
      }
      else {
        qu_local = (mpt_decode_queue *)0xfffffffffffffff0;
      }
    }
  }
  return (ssize_t)qu_local;
}

Assistant:

extern ssize_t mpt_queue_peek(MPT_STRUCT(decode_queue) *qu, size_t max, void *dst)
{
	MPT_STRUCT(message) msg;
	struct iovec src;
	size_t off, len;
	int ret;
	
	if (!(len = qu->data.len)) {
		return MPT_ERROR(MissingData);
	}
	off = qu->data.off;
	msg.base = ((uint8_t *) qu->data.base) + off;
	
	/* message setup */
	if (len > (qu->data.max - off)) {
		msg.used = qu->data.max - off;
		msg.clen = 1;
		msg.cont = &src;
		src.iov_base = qu->data.base;
		src.iov_len  = len - msg.used;
	} else {
		msg.used = len;
		msg.clen = 0;
		msg.cont = 0;
	}
	off = qu->_state.data.pos;
	
	/* final data available */
	if (!qu->_dec) {
		if ((ret = qu->_state.data.msg) >= 0) {
			off += ret;
		}
		if (!dst) {
			ret = len - off;
			return ret >= 0 ? ret : MPT_ERROR(MissingData);
		}
		if (off && (mpt_message_read(&msg, off, 0) < off)) {
			return MPT_ERROR(MissingData);
		}
		return mpt_message_read(&msg, max, dst);
	}
	/* work area reduces offset */
	len = qu->_state.curr;
	if (len < off) {
		off = len;
	}
	if (off && (mpt_message_read(&msg, off, 0) < off)) {
		return MPT_ERROR(MissingData);
	}
	src.iov_base = (void *) msg.base;
	src.iov_len  = msg.used;
	
	/* reduce wrap size */
	qu->_state.data.pos -= off;
	qu->_state.curr -= off;
	/* peek for new data */
	ret = qu->_dec(&qu->_state, &src, 0);
	len = qu->_state.data.pos;
	msg.base = (uint8_t *) msg.base + len;
	/* restore offsets */
	qu->_state.data.pos = len + off;
	qu->_state.curr += off;
	len = qu->_state.data.len;
	
	if (ret < 0 || !dst) {
		return len;
	}
	/* get data start and length */
	if (len > max) {
		len = max;
	}
	(void) memcpy(dst, msg.base, len);
	
	return len;
}